

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

JSON * __thiscall chaiscript::json::JSON::operator[](JSON *this,size_t index)

{
  variant_alternative_t<2UL,_variant<std::nullptr_t,_QuickFlatMap<basic_string<char,_char_traits<char>,_allocator<char>_>,_JSON,_equal_to<void>_>,_vector<JSON,_allocator<JSON>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_double,_long,_bool>_>
  *this_00;
  size_type sVar1;
  reference pvVar2;
  variant_alternative_t<2UL,_variant<std::nullptr_t,_QuickFlatMap<basic_string<char,_char_traits<char>,_allocator<char>_>,_JSON,_equal_to<void>_>,_vector<JSON,_allocator<JSON>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_double,_long,_bool>_>
  *vec;
  size_t index_local;
  JSON *this_local;
  
  this_00 = Internal::Vector(&this->internal);
  sVar1 = std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>::size
                    (this_00);
  if (sVar1 <= index) {
    std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>::resize
              (this_00,index + 1);
  }
  pvVar2 = std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>::operator[]
                     (this_00,index);
  return pvVar2;
}

Assistant:

JSON &operator[](const size_t index) {
      auto &vec = internal.Vector();
      if (index >= vec.size()) {
        vec.resize(index + 1);
      }

      return vec.operator[](index);
    }